

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_meshb_int(FILE *file,REF_INT version,REF_INT value)

{
  size_t sVar1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  long long_value;
  REF_INT local_20;
  int int_value;
  REF_INT value_local;
  REF_INT version_local;
  FILE *file_local;
  
  local_20 = value;
  int_value = version;
  _value_local = file;
  if (version < 4) {
    long_value._4_4_ = value;
    sVar1 = fwrite((void *)((long)&long_value + 4),4,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x4a1,"ref_gather_meshb_int","int value",1,sVar1);
      return 1;
    }
  }
  else {
    ref_private_status_reis_ai = (REF_LONG)value;
    sVar1 = fwrite(&ref_private_status_reis_ai,8,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x4a4,"ref_gather_meshb_int","long value",1,sVar1);
      return 1;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_meshb_int(FILE *file, REF_INT version,
                                               REF_INT value) {
  int int_value;
  long long_value;
  if (version < 4) {
    int_value = (int)value;
    REIS(1, fwrite(&int_value, sizeof(int), 1, file), "int value");
  } else {
    long_value = (long)value;
    REIS(1, fwrite(&long_value, sizeof(long), 1, file), "long value");
  }
  return REF_SUCCESS;
}